

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O2

el_action_t em_copy_prev_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  pwVar1 = (el->el_line).buffer;
  pwVar4 = (el->el_line).cursor;
  if (pwVar4 == pwVar1) {
    eVar2 = '\x06';
  }
  else {
    pwVar3 = c__prev_word(pwVar4,pwVar1,(el->el_state).argument,ce__isword);
    c_insert(el,(wchar_t)((ulong)((long)(el->el_line).cursor - (long)pwVar3) >> 2));
    pwVar1 = (el->el_line).cursor;
    for (pwVar4 = pwVar1; (pwVar3 < pwVar1 && (pwVar4 < (el->el_line).lastchar));
        pwVar4 = pwVar4 + 1) {
      *pwVar4 = *pwVar3;
      pwVar3 = pwVar3 + 1;
    }
    (el->el_line).cursor = pwVar4;
    eVar2 = '\x04';
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_copy_prev_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *oldc, *dp;

	if (el->el_line.cursor == el->el_line.buffer)
		return CC_ERROR;

	/* does a bounds check */
	cp = c__prev_word(el->el_line.cursor, el->el_line.buffer,
	    el->el_state.argument, ce__isword);

	c_insert(el, (int)(el->el_line.cursor - cp));
	oldc = el->el_line.cursor;
	for (dp = oldc; cp < oldc && dp < el->el_line.lastchar; cp++)
		*dp++ = *cp;

	el->el_line.cursor = dp;/* put cursor at end */

	return CC_REFRESH;
}